

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

void OnRPCStarted(void)

{
  long in_FS_OFFSET;
  function<void_(SynchronizationState,_const_CBlockIndex_*)> in_stack_ffffffffffffffa8;
  connection local_30;
  _Bind<void_(*(std::_Placeholder<2>))(const_CBlockIndex_*)> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20._M_f = RPCNotifyBlockChange;
  std::function<void(SynchronizationState,CBlockIndex_const*)>::
  function<std::_Bind<void(*(std::_Placeholder<2>))(CBlockIndex_const*)>,void>
            ((function<void(SynchronizationState,CBlockIndex_const*)> *)&stack0xffffffffffffffb0,
             &local_20);
  CClientUIInterface::NotifyBlockTip_connect
            ((CClientUIInterface *)&local_30,in_stack_ffffffffffffffa8);
  boost::signals2::connection::operator=(&rpc_notify_block_change_connection,&local_30);
  boost::detail::weak_count::~weak_count(&local_30._weak_connection_body.pn);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffffb0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void OnRPCStarted()
{
    rpc_notify_block_change_connection = uiInterface.NotifyBlockTip_connect(std::bind(RPCNotifyBlockChange, std::placeholders::_2));
}